

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
TryParseHex<unsigned_char>
          (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,string_view str)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  bool bVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  byte local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  long local_38;
  
  uVar3 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_58,uVar3 >> 1);
  if (uVar3 != 0) {
    pbVar4 = (byte *)(str._M_str + uVar3);
    pbVar5 = (byte *)str._M_str;
    do {
      bVar1 = *pbVar5;
      if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) {
        pbVar6 = pbVar5 + 1;
      }
      else {
        bVar1 = HexDigit(bVar1);
        pbVar6 = pbVar5 + 1;
        if (pbVar6 == pbVar4) {
          (__return_storage_ptr__->
          super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
          .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ._M_engaged = false;
          bVar7 = false;
        }
        else {
          bVar2 = HexDigit(pbVar5[1]);
          pbVar6 = pbVar5 + 2;
          bVar7 = (char)(bVar2 | bVar1) < '\0';
          if (bVar7) {
            (__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_engaged = false;
          }
          else {
            local_59 = bVar2 | bVar1 << 4;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&local_58,&local_59);
          }
          bVar7 = !bVar7;
        }
        if (!bVar7) goto LAB_003fad59;
      }
      pbVar5 = pbVar6;
    } while (pbVar6 != pbVar4);
  }
  *(pointer *)
   &(__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           )._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl + 8) =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
           )._M_payload.
           super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl + 0x10) =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
  _M_engaged = true;
LAB_003fad59:
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Byte>> TryParseHex(std::string_view str)
{
    std::vector<Byte> vch;
    vch.reserve(str.size() / 2); // two hex characters form a single byte

    auto it = str.begin();
    while (it != str.end()) {
        if (IsSpace(*it)) {
            ++it;
            continue;
        }
        auto c1 = HexDigit(*(it++));
        if (it == str.end()) return std::nullopt;
        auto c2 = HexDigit(*(it++));
        if (c1 < 0 || c2 < 0) return std::nullopt;
        vch.push_back(Byte(c1 << 4) | Byte(c2));
    }
    return vch;
}